

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void SDL_UpdateRect(SDL12_Surface *screen12,Sint32 x,Sint32 y,Uint32 w,Uint32 h)

{
  Uint32 local_30;
  Uint32 local_2c;
  SDL12_Rect local_28;
  SDL12_Rect rect12;
  Uint32 h_local;
  Uint32 w_local;
  Sint32 y_local;
  Sint32 x_local;
  SDL12_Surface *screen12_local;
  
  if (screen12 != (SDL12_Surface *)0x0) {
    local_28.x = (Sint16)x;
    local_28.y = (Sint16)y;
    local_2c = w;
    if (w == 0) {
      local_2c = screen12->w;
    }
    local_28.w = (Uint16)local_2c;
    local_30 = h;
    if (h == 0) {
      local_30 = screen12->h;
    }
    local_28.h = (Uint16)local_30;
    rect12._0_4_ = h;
    rect12._4_4_ = w;
    SDL_UpdateRects(screen12,1,&local_28);
  }
  return;
}

Assistant:

SDLCALL
SDL_UpdateRect(SDL12_Surface *screen12, Sint32 x, Sint32 y, Uint32 w, Uint32 h)
{
    if (screen12) {
        SDL12_Rect rect12;
        rect12.x = (Sint16) x;
        rect12.y = (Sint16) y;
        rect12.w = (Uint16) (w ? w : screen12->w);
        rect12.h = (Uint16) (h ? h : screen12->h);
        SDL_UpdateRects(screen12, 1, &rect12);
    }
}